

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O2

void pzshape::TPZShapeQuad::SideShape
               (int side,TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,
               TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  
  if ((uint)side < 4) {
    pdVar1 = TPZFMatrix<double>::operator()(phi,0,0);
    *pdVar1 = 1.0;
  }
  else {
    if (side - 4U < 4) {
      TPZShapeLinear::Shape(pt,id,order,phi,dphi);
      return;
    }
    if (side == 8) {
      Shape(pt,id,order,phi,dphi);
      return;
    }
  }
  return;
}

Assistant:

void TPZShapeQuad::SideShape(int side,TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order,
								 TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		switch(side) {
			case 0:
			case 1:
			case 2:
			case 3:
				TPZShapePoint::Shape(pt, id, order, phi, dphi);
				break;
			case 4:
			case 5:
			case 6:
			case 7:
				TPZShapeLinear::Shape(pt, id, order, phi, dphi);
				break;
			case 8:
				Shape(pt, id, order, phi, dphi);
		}
	}